

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

int bmcg_sat_solver_quantify
              (bmcg_sat_solver **pSats,Gia_Man_t *p,int iLit,int fHash,
              _func_int_void_ptr_int *pFuncCiToKeep,void *pData,Vec_Int_t *vDLits)

{
  bmcg_sat_solver **ppbVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *vCiVars;
  int Fill;
  uint uVar6;
  long lVar7;
  Vec_Str_t *vSop;
  long lVar8;
  int Lit;
  int local_74;
  Vec_Int_t *local_70;
  uint local_54;
  bmcg_sat_solver **local_50;
  ulong local_48;
  _func_int_void_ptr_int *local_40;
  void *local_38;
  
  local_50 = pSats;
  local_40 = pFuncCiToKeep;
  local_38 = pData;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  vCiVars = (Vec_Int_t *)malloc(0x10);
  vCiVars->nCap = 100;
  vCiVars->nSize = 0;
  piVar5 = (int *)malloc(400);
  vCiVars->pArray = piVar5;
  if (vDLits != (Vec_Int_t *)0x0) {
    vDLits->nSize = 0;
  }
  if (iLit < 2) {
    return iLit;
  }
  iVar2 = 0;
  if ((p->vCopies).nSize < p->nObjs) {
    Vec_IntFillExtra(&p->vCopies,p->nObjs,Fill);
    iVar2 = p_00->nSize;
  }
  Vec_IntPush(p_00,0);
  if ((p->vCopies).nSize < 1) {
LAB_005bdef0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(p->vCopies).pArray = iVar2;
  if (iVar2 != 0) {
    __assert_fail("iVar == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                  ,0x448,
                  "int bmcg_sat_solver_quantify(bmcg_sat_solver **, Gia_Man_t *, int, int, int (*)(void *, int), void *, Vec_Int_t *)"
                 );
  }
  iVar2 = Gia_ManSatAndCollect_rec(p,(uint)iLit >> 1,p_00,vCiVars);
  ppbVar1 = local_50;
  Gia_ManQuantLoadCnf(p,p_00,local_50);
  if (iVar2 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar6 = (iLit & 1U) + iVar2 * 2;
  local_54 = uVar6 ^ 1;
  local_74 = 1;
  iVar2 = glucose_solver_addclause((SimpSolver *)*ppbVar1,(int *)&local_54,1);
  if (iVar2 == 0) {
    local_70 = (Vec_Int_t *)0x0;
LAB_005bdcbe:
    local_74 = 1;
    vSop = (Vec_Str_t *)0x0;
  }
  else {
    local_70 = (Vec_Int_t *)0x0;
    iVar2 = glucose_solver_solve((SimpSolver *)*ppbVar1,(int *)0x0,0);
    vSop = (Vec_Str_t *)0x0;
    if (iVar2 != -1) {
      local_54 = uVar6;
      iVar2 = glucose_solver_addclause((SimpSolver *)ppbVar1[1],(int *)&local_54,1);
      if (iVar2 == 0) {
        vSop = (Vec_Str_t *)0x0;
        local_74 = 0;
      }
      else {
        local_70 = (Vec_Int_t *)0x0;
        iVar2 = glucose_solver_solve((SimpSolver *)ppbVar1[1],(int *)0x0,0);
        vSop = (Vec_Str_t *)0x0;
        local_74 = 0;
        if (iVar2 != -1) {
          uVar6 = p_00->nSize;
          local_70 = (Vec_Int_t *)malloc(0x10);
          uVar3 = 0x10;
          if (0xe < uVar6 - 1) {
            uVar3 = uVar6;
          }
          local_70->nCap = uVar3;
          if (uVar3 == 0) {
            local_70->pArray = (int *)0x0;
            local_70->nSize = uVar6;
LAB_005bdce4:
            piVar5 = (int *)0x0;
          }
          else {
            piVar5 = (int *)malloc((long)(int)uVar3 << 2);
            local_70->pArray = piVar5;
            local_70->nSize = uVar6;
            if (piVar5 == (int *)0x0) goto LAB_005bdce4;
            memset(piVar5,0xff,(long)(int)uVar6 << 2);
          }
          local_74 = 1;
          vSop = (Vec_Str_t *)0x0;
          if (0 < vCiVars->nSize) {
            lVar8 = 0;
            local_48 = (ulong)uVar6;
            do {
              iVar2 = vCiVars->pArray[lVar8];
              lVar7 = (long)iVar2;
              if ((lVar7 < 0) || (p_00->nSize <= iVar2)) goto LAB_005bdf0f;
              iVar4 = p_00->pArray[lVar7];
              if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if ((~(uint)*(undefined8 *)(p->pObjs + iVar4) & 0x9fffffff) != 0) {
                __assert_fail("Gia_ObjIsCi(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                              ,0x476,
                              "int bmcg_sat_solver_quantify(bmcg_sat_solver **, Gia_Man_t *, int, int, int (*)(void *, int), void *, Vec_Int_t *)"
                             );
              }
              iVar4 = (*local_40)(local_38,(uint)((ulong)*(undefined8 *)(p->pObjs + iVar4) >> 0x20)
                                           & 0x1fffffff);
              if (iVar4 != 0) {
                if ((int)local_48 <= iVar2) goto LAB_005bdef0;
                piVar5[lVar7] = (int)lVar8;
                vSop = (Vec_Str_t *)(ulong)((int)vSop + 1);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < vCiVars->nSize);
            if ((int)vSop == 0) goto LAB_005bdcbe;
            if ((int)vSop == vCiVars->nSize) {
              vSop = (Vec_Str_t *)0x0;
              local_74 = iLit;
            }
            else {
              vSop = Glucose_GenerateCubes(local_50,vCiVars,local_70,0);
              if (0 < vCiVars->nSize) {
                piVar5 = vCiVars->pArray;
                lVar8 = 0;
                do {
                  iVar2 = piVar5[lVar8];
                  if (((long)iVar2 < 0) || (p_00->nSize <= iVar2)) {
LAB_005bdf0f:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  piVar5[lVar8] = p_00->pArray[iVar2];
                  lVar8 = lVar8 + 1;
                } while (lVar8 < vCiVars->nSize);
              }
              if (vDLits != (Vec_Int_t *)0x0) {
                bmcg_sat_generate_dvars(vCiVars,vSop,vDLits);
              }
              local_74 = Gia_ManFactorSop(p,vCiVars,vSop,fHash);
            }
          }
        }
      }
    }
  }
  piVar5 = p_00->pArray;
  if (p_00->nSize < 1) {
    if (piVar5 == (int *)0x0) goto LAB_005bde88;
  }
  else {
    lVar8 = 0;
    do {
      iVar2 = piVar5[lVar8];
      if (((long)iVar2 < 0) || ((p->vCopies).nSize <= iVar2)) goto LAB_005bdef0;
      (p->vCopies).pArray[iVar2] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < p_00->nSize);
  }
  free(piVar5);
LAB_005bde88:
  free(p_00);
  if (vCiVars->pArray != (int *)0x0) {
    free(vCiVars->pArray);
  }
  free(vCiVars);
  if (local_70 != (Vec_Int_t *)0x0) {
    if (local_70->pArray != (int *)0x0) {
      free(local_70->pArray);
    }
    free(local_70);
  }
  if (vSop != (Vec_Str_t *)0x0) {
    if (vSop->pArray != (char *)0x0) {
      free(vSop->pArray);
    }
    free(vSop);
  }
  return local_74;
}

Assistant:

int bmcg_sat_solver_quantify( bmcg_sat_solver * pSats[], Gia_Man_t * p, int iLit, int fHash, int(*pFuncCiToKeep)(void *, int), void * pData, Vec_Int_t * vDLits )
{
    Vec_Int_t * vObjsUsed = Vec_IntAlloc( 100 ); // GIA objs
    Vec_Int_t * vCiVars = Vec_IntAlloc( 100 );   // CI SAT vars
    Vec_Int_t * vVarMap = NULL; Vec_Str_t * vSop = NULL; 
    int i, iVar, iVarLast, Lit, RetValue, Count = 0, Result = -1;
    if ( vDLits ) Vec_IntClear( vDLits );
    if ( iLit < 2 )
        return iLit;
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    // assign variable number 0 to const0 node
    iVar = Vec_IntSize(vObjsUsed); 
    Vec_IntPush( vObjsUsed, 0 );
    Gia_ObjSetCopyArray( p, 0, iVar );
    assert( iVar == 0 );    

    // collect other variables
    iVarLast = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit), vObjsUsed, vCiVars );
    Gia_ManQuantLoadCnf( p, vObjsUsed, pSats );

    // check constants
    Lit = Abc_Var2Lit( iVarLast, !Abc_LitIsCompl(iLit) ); 
    RetValue = bmcg_sat_solver_addclause( pSats[0], &Lit, 1 ); // offset
    if ( !RetValue || bmcg_sat_solver_solve(pSats[0], NULL, 0) == GLUCOSE_UNSAT )
    {
        Result = 1;
        goto cleanup;
    }
    Lit = Abc_Var2Lit( iVarLast, Abc_LitIsCompl(iLit) );
    RetValue = bmcg_sat_solver_addclause( pSats[1], &Lit, 1 ); // onset
    if ( !RetValue || bmcg_sat_solver_solve(pSats[1], NULL, 0) == GLUCOSE_UNSAT )
    {
        Result = 0;
        goto cleanup;
    }
/*
    // reorder CI SAT variables to have keep-vars first
    Vec_Int_t * vCiVars2 = Vec_IntAlloc( 100 );   // CI SAT vars
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntPush( vCiVars2, iVar );
    }
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( !pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntPush( vCiVars2, iVar );
    }
    ABC_SWAP( Vec_Int_t *, vCiVars2, vCiVars );
    Vec_IntFree( vCiVars2 );
*/
    // map CI SAT variables into their indexes used in the cubes
    vVarMap = Vec_IntStartFull( Vec_IntSize(vObjsUsed) );
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntWriteEntry( vVarMap, iVar, i ), Count++;
    }
    if ( Count == 0 || Count == Vec_IntSize(vCiVars) )
    {
        Result = Count == 0 ? 1 : iLit;
        goto cleanup;
    }
    // generate cubes
    vSop = Glucose_GenerateCubes( pSats, vCiVars, vVarMap, 0 );
    //printf( "%s", Vec_StrArray(vSop) );
    // convert into object IDs
    Vec_IntForEachEntry( vCiVars, iVar, i )
        Vec_IntWriteEntry( vCiVars, i, Vec_IntEntry(vObjsUsed, iVar) );
    // generate unate variables
    if ( vDLits )
        bmcg_sat_generate_dvars( vCiVars, vSop, vDLits );
    // convert into an AIG
    RetValue = Gia_ManAndNum(p);
    Result = Gia_ManFactorSop( p, vCiVars, vSop, fHash );

    // report the result
//    printf( "Performed quantification with %5d nodes, %3d keep-vars, %3d quant-vars, resulting in %5d cubes and %5d nodes. ", 
//        Vec_IntSize(vObjsUsed), Count, Vec_IntSize(vCiVars) - Count, Vec_StrCountEntry(vSop, '\n'), Gia_ManAndNum(p)-RetValue );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clkAll );

cleanup:
    Vec_IntForEachEntry( vObjsUsed, iVar, i )
        Gia_ObjSetCopyArray( p, iVar, -1 );
    Vec_IntFree( vObjsUsed );
    Vec_IntFree( vCiVars );
    Vec_IntFreeP( &vVarMap );
    Vec_StrFreeP( &vSop );
    return Result;
}